

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

void __thiscall
SpeciesReaction::SpeciesReaction
          (SpeciesReaction *this,double rate_constant,double volume,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *reactants,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *products)

{
  pointer pbVar1;
  pointer pbVar2;
  ulong uVar3;
  invalid_argument *this_00;
  
  (this->super_Reaction).super_enable_shared_from_this<Reaction>._M_weak_this.
  super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Reaction).super_enable_shared_from_this<Reaction>._M_weak_this.
  super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Reaction).old_prop_ = 0.0;
  (this->super_Reaction).remove_ = false;
  (this->super_Reaction).tRNA_reaction_ = false;
  (this->super_Reaction)._vptr_Reaction = (_func_int **)&PTR_CalculatePropensity_0019dbd0;
  this->rate_constant_ = rate_constant;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->reactants_,reactants);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->products_,products);
  (this->super_Reaction).old_prop_ = 0.0;
  pbVar1 = (this->reactants_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->reactants_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)pbVar2 - (long)pbVar1;
  if (uVar3 < 0x41) {
    if ((pbVar2 == pbVar1) &&
       ((this->products_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->products_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"You must specify at least one product or reactant.");
    }
    else if (rate_constant <= 0.0) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Reaction rate constant cannot be zero.");
    }
    else {
      if (0.0 < volume) {
        if (uVar3 == 0x40) {
          this->rate_constant_ = this->rate_constant_ / (volume * 6.0221409e+23);
        }
        return;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Reaction volume cannot be zero.");
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Pinetree does not support reactions with more than two reactant species.");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

SpeciesReaction::SpeciesReaction(double rate_constant, double volume,
                                 const std::vector<std::string> &reactants,
                                 const std::vector<std::string> &products)
    : rate_constant_(rate_constant),
      reactants_(reactants),
      products_(products) {
  // Error checking
  old_prop_ = 0;
  if (reactants_.size() > 2) {
    throw std::invalid_argument(
        "Pinetree does not support reactions with "
        "more than two reactant species.");
  }
  if (reactants_.size() == 0 && products_.size() == 0) {
    throw std::invalid_argument(
        "You must specify at least one product or reactant.");
  }
  if (rate_constant <= 0) {
    throw std::invalid_argument("Reaction rate constant cannot be zero.");
  }
  if (volume <= 0) {
    throw std::invalid_argument("Reaction volume cannot be zero.");
  }
  // Rate constant has to be transformed from macroscopic to mesoscopic
  // TODO: make more sophisticated and support different stoichiometries
  if (reactants_.size() == 2) {
    rate_constant_ = rate_constant_ / (AVAGADRO * volume);
  }
}